

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

void __thiscall
avro::BufferCopyInInputStream::BufferCopyInInputStream
          (BufferCopyInInputStream *this,auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *in,
          size_t bufferSize)

{
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *paVar1;
  BufferCopyIn *pBVar2;
  BufferCopyIn *in_RDX;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *in_RDI;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *in_stack_ffffffffffffffb8;
  
  InputStream::InputStream((InputStream *)in_RDI);
  in_RDI->_M_ptr = (BufferCopyIn *)&PTR__BufferCopyInInputStream_00235570;
  in_RDI[1]._M_ptr = in_RDX;
  paVar1 = in_RDI + 2;
  pBVar2 = (BufferCopyIn *)operator_new__((ulong)in_RDX);
  paVar1->_M_ptr = pBVar2;
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyIn>::auto_ptr
            (in_RDI,in_stack_ffffffffffffffb8);
  in_RDI[4]._M_ptr = (BufferCopyIn *)0x0;
  in_RDI[5]._M_ptr = in_RDI[2]._M_ptr;
  in_RDI[6]._M_ptr = (BufferCopyIn *)0x0;
  return;
}

Assistant:

BufferCopyInInputStream(auto_ptr<BufferCopyIn>& in, size_t bufferSize) :
        bufferSize_(bufferSize),
        buffer_(new uint8_t[bufferSize]),
        in_(in),
        byteCount_(0),
        next_(buffer_),
        available_(0) { }